

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::Matches(TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          *this,ArgumentTuple *args)

{
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>&>,testing::Matcher<ot::commissioner::Config_const&>>,std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>&,ot::commissioner::Config_const&>>
                    (&this->matchers_,args);
  if (bVar2) {
    peVar1 = (this->extra_matcher_).
             super_MatcherBase<const_std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar1,args);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }